

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol
          (DescriptorPool *this,ConstStringParam symbol_name)

{
  bool bVar1;
  pointer pTVar2;
  StringPiece local_80;
  SymbolBase *local_70;
  StringPiece local_68;
  DescriptorPool *local_58;
  FileDescriptor *file_result;
  StringPiece local_40;
  Symbol local_30;
  Symbol result;
  MutexLockMaybe lock;
  ConstStringParam symbol_name_local;
  DescriptorPool *this_local;
  
  internal::MutexLockMaybe::MutexLockMaybe((MutexLockMaybe *)&result,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    pTVar2 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pTVar2->known_bad_symbols_);
    pTVar2 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pTVar2->known_bad_files_);
  }
  pTVar2 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::operator->(&this->tables_);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_40,symbol_name);
  local_30 = Tables::FindSymbol(pTVar2,local_40);
  bVar1 = Symbol::IsNull(&local_30);
  if (bVar1) {
    if ((this->underlay_ == (DescriptorPool *)0x0) ||
       (local_58 = (DescriptorPool *)FindFileContainingSymbol(this->underlay_,symbol_name),
       this_local = local_58, local_58 == (DescriptorPool *)0x0)) {
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_68,symbol_name);
      bVar1 = TryFindSymbolInFallbackDatabase(this,local_68);
      if (bVar1) {
        pTVar2 = std::
                 unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ::operator->(&this->tables_);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_80,symbol_name);
        local_70 = (SymbolBase *)Tables::FindSymbol(pTVar2,local_80);
        local_30 = (Symbol)local_70;
        bVar1 = Symbol::IsNull(&local_30);
        if (!bVar1) {
          this_local = (DescriptorPool *)Symbol::GetFile(&local_30);
          goto LAB_00649d2a;
        }
      }
      this_local = (DescriptorPool *)0x0;
    }
  }
  else {
    this_local = (DescriptorPool *)Symbol::GetFile(&local_30);
  }
LAB_00649d2a:
  file_result._0_4_ = 1;
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)&result);
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    ConstStringParam symbol_name) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != nullptr) {
    const FileDescriptor* file_result =
        underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != nullptr) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return nullptr;
}